

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_threads.c
# Opt level: O1

ares_status_t ares_channel_threading_init(ares_channel_t *channel)

{
  ares_thread_mutex_t *paVar1;
  ares_thread_cond_t *paVar2;
  ares_status_t aVar3;
  bool bVar4;
  
  paVar1 = ares_thread_mutex_create();
  channel->lock = paVar1;
  bVar4 = false;
  if (paVar1 == (ares_thread_mutex_t *)0x0) {
    aVar3 = ARES_ENOMEM;
  }
  else {
    paVar2 = ares_thread_cond_create();
    channel->cond_empty = paVar2;
    bVar4 = paVar2 != (ares_thread_cond_t *)0x0;
    aVar3 = ARES_ENOMEM;
    if (bVar4) {
      aVar3 = ARES_SUCCESS;
    }
  }
  if (!bVar4) {
    ares_channel_threading_destroy(channel);
  }
  return aVar3;
}

Assistant:

ares_status_t ares_channel_threading_init(ares_channel_t *channel)
{
  ares_status_t status = ARES_SUCCESS;

  /* Threading is optional! */
  if (!ares_threadsafety()) {
    return ARES_SUCCESS;
  }

  channel->lock = ares_thread_mutex_create();
  if (channel->lock == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  channel->cond_empty = ares_thread_cond_create();
  if (channel->cond_empty == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

done:
  if (status != ARES_SUCCESS) {
    ares_channel_threading_destroy(channel);
  }
  return status;
}